

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O2

void __thiscall bgui::BaseWindow::~BaseWindow(BaseWindow *this)

{
  BaseWindowData *pBVar1;
  
  this->_vptr_BaseWindow = (_func_int **)&PTR__BaseWindow_001622e8;
  sendClose(this);
  waitForClose(this);
  pthread_mutex_destroy((pthread_mutex_t *)&this->p->mutex);
  pBVar1 = this->p;
  if (pBVar1->inotify_fd != 0) {
    close(pBVar1->inotify_fd);
    pBVar1 = this->p;
  }
  (*(pBVar1->image->f).destroy_image)(pBVar1->image);
  XFreeFontInfo(0,this->p->font,1);
  XFreeGC(this->p->display,this->p->gc);
  XDestroyWindow(this->p->display,this->p->window);
  XCloseDisplay(this->p->display);
  pBVar1 = this->p;
  if (pBVar1 != (BaseWindowData *)0x0) {
    BaseWindowData::~BaseWindowData(pBVar1);
  }
  operator_delete(pBVar1);
  return;
}

Assistant:

BaseWindow::~BaseWindow()
{
  sendClose();
  waitForClose();

  pthread_mutex_destroy(&(p->mutex));

#ifdef INCLUDE_INOTIFY

  if (p->inotify_fd != 0)
  {
    close(p->inotify_fd);
  }

#endif

  XDestroyImage(p->image);
  XFreeFontInfo(0, p->font, 1);
  XFreeGC(p->display, p->gc);
  XDestroyWindow(p->display, p->window);
  XCloseDisplay(p->display);

  delete p;
}